

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

void __thiscall
pbrt::AliasTable::AliasTable(AliasTable *this,span<const_float> weights,Allocator alloc)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  Float *pFVar4;
  size_t sVar5;
  size_t sVar6;
  size_t i;
  ulong uVar7;
  float *__first;
  Bin *pBVar8;
  long lVar9;
  float fVar10;
  double dVar11;
  undefined1 in_XMM2 [16];
  value_type local_78;
  int vb;
  undefined1 auStack_64 [12];
  pointer local_58;
  Float va;
  undefined1 auStack_44 [12];
  polymorphic_allocator<pbrt::AliasTable::Bin> pStack_40;
  pointer local_38;
  
  sVar6 = weights.n;
  __first = weights.ptr;
  pStack_40.memoryResource = _va;
  _va = alloc.memoryResource;
  pstd::vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
  vector(&this->bins,sVar6,(polymorphic_allocator<pbrt::AliasTable::Bin> *)&va);
  dVar11 = std::accumulate<float_const*,double>(__first,__first + sVar6,0.0);
  fVar10 = (float)dVar11;
  auVar3._12_4_ = 0;
  auVar3._0_12_ = auStack_64;
  _vb = auVar3 << 0x20;
  va = fVar10;
  if (fVar10 <= 0.0) {
    LogFatal<char_const(&)[4],char_const(&)[2],char_const(&)[4],float&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
               ,0x234,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])"sum",
               (char (*) [2])0x28556e7,(char (*) [4])"sum",(float *)&va,(char (*) [2])0x28556e7,&vb)
    ;
  }
  pFVar4 = &((this->bins).ptr)->pdf;
  for (sVar5 = 0; sVar6 != sVar5; sVar5 = sVar5 + 1) {
    *pFVar4 = __first[sVar5] / fVar10;
    pFVar4 = pFVar4 + 3;
  }
  _vb = ZEXT416(0) << 0x20;
  local_38 = (pointer)0x0;
  local_58 = (pointer)0x0;
  lVar9 = 4;
  _va = _vb;
  for (uVar7 = 0; uVar2 = (this->bins).nStored, uVar7 < uVar2; uVar7 = uVar7 + 1) {
    auVar3 = vcvtusi2ss_avx512f(in_XMM2,uVar2);
    local_78.pHat = auVar3._0_4_ * *(float *)((long)&((this->bins).ptr)->q + lVar9);
    local_78.index = uVar7;
    if (1.0 <= local_78.pHat) {
      std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                ((vector<Outcome,_std::allocator<Outcome>_> *)&vb,&local_78);
    }
    else {
      std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                ((vector<Outcome,_std::allocator<Outcome>_> *)&va,&local_78);
    }
    lVar9 = lVar9 + 0xc;
  }
  while( true ) {
    if (_va == pStack_40.memoryResource) break;
    pBVar8 = (this->bins).ptr;
    if (_vb == (pointer)auStack_64._4_8_) goto LAB_002fdbb7;
    fVar10 = ((pointer)((long)pStack_40.memoryResource + -0x10))->pHat;
    sVar6 = ((pointer)((long)pStack_40.memoryResource + -0x10))->index;
    local_78.index = ((pointer)(auStack_64._4_8_ + -0x10))->index;
    fVar1 = ((pointer)(auStack_64._4_8_ + -0x10))->pHat;
    pStack_40.memoryResource = (memory_resource *)((long)pStack_40.memoryResource + -0x10);
    auStack_64._4_8_ = (pointer)(auStack_64._4_8_ + -0x10);
    pBVar8[sVar6].q = fVar10;
    local_78.pHat = fVar10 + fVar1 + -1.0;
    pBVar8[sVar6].alias = (int)local_78.index;
    if (1.0 <= local_78.pHat) {
      std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                ((vector<Outcome,_std::allocator<Outcome>_> *)&vb,&local_78);
    }
    else {
      std::vector<Outcome,_std::allocator<Outcome>_>::push_back
                ((vector<Outcome,_std::allocator<Outcome>_> *)&va,&local_78);
    }
  }
  pBVar8 = (this->bins).ptr;
LAB_002fdbb7:
  for (; (pointer)auStack_64._4_8_ != _vb; auStack_64._4_8_ = auStack_64._4_8_ + -0x10) {
    sVar6 = ((pointer)(auStack_64._4_8_ + -0x10))->index;
    pBVar8[sVar6].q = 1.0;
    pBVar8[sVar6].alias = -1;
  }
  pBVar8 = (this->bins).ptr;
  for (; pStack_40.memoryResource != _va;
      pStack_40.memoryResource = (memory_resource *)((long)pStack_40.memoryResource + -0x10)) {
    sVar6 = ((pointer)((long)pStack_40.memoryResource + -0x10))->index;
    pBVar8[sVar6].q = 1.0;
    pBVar8[sVar6].alias = -1;
  }
  std::vector<Outcome,_std::allocator<Outcome>_>::~vector
            ((vector<Outcome,_std::allocator<Outcome>_> *)&vb);
  std::vector<Outcome,_std::allocator<Outcome>_>::~vector
            ((vector<Outcome,_std::allocator<Outcome>_> *)&va);
  return;
}

Assistant:

AliasTable::AliasTable(pstd::span<const Float> weights, Allocator alloc)
    : bins(weights.size(), alloc) {
    // Normalize _weights_ to compute alias table PDF
    Float sum = std::accumulate(weights.begin(), weights.end(), 0.);
    CHECK_GT(sum, 0);
    for (size_t i = 0; i < weights.size(); ++i)
        bins[i].pdf = weights[i] / sum;

    // Create alias table work lists
    struct Outcome {
        Float pHat;
        size_t index;
    };
    std::vector<Outcome> under, over;
    for (size_t i = 0; i < bins.size(); ++i) {
        // Add outcome _i_ to an alias table work list
        Float pHat = bins[i].pdf * bins.size();
        if (pHat < 1)
            under.push_back(Outcome{pHat, i});
        else
            over.push_back(Outcome{pHat, i});
    }

    // Process under and over work item together
    while (!under.empty() && !over.empty()) {
        // Remove an item from each alias table work list
        Outcome un = under.back(), ov = over.back();
        under.pop_back();
        over.pop_back();

        // Initialize probability and alias for _un_
        bins[un.index].q = un.pHat;
        bins[un.index].alias = ov.index;

        // Push excess probability on to work list
        Float pExcess = (un.pHat + ov.pHat) - 1;
        if (pExcess < 1)
            under.push_back(Outcome{pExcess, ov.index});
        else
            over.push_back(Outcome{pExcess, ov.index});
    }

    // Handle remaining alias table work items
    while (!over.empty()) {
        Outcome ov = over.back();
        over.pop_back();
        bins[ov.index].q = 1;
        bins[ov.index].alias = -1;
    }
    while (!under.empty()) {
        Outcome un = under.back();
        under.pop_back();
        bins[un.index].q = 1;
        bins[un.index].alias = -1;
    }
}